

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

char * stb_strip_final_slash(char *t)

{
  char cVar1;
  size_t sVar2;
  char cVar3;
  
  if (*t != '\0') {
    sVar2 = strlen(t);
    cVar1 = t[sVar2 - 1];
    if ((cVar1 == '\\') || (cVar1 == '/')) {
      if ((sVar2 - 1 == 2) && (t[1] == ':')) {
        cVar3 = '/';
        if (cVar1 != '\\') {
          return t;
        }
      }
      else {
        cVar3 = '\0';
      }
      t[sVar2 - 1] = cVar3;
    }
  }
  return t;
}

Assistant:

char *stb_strip_final_slash(char *t)
{
   if (t[0]) {
      char *z = t + strlen(t) - 1;
      // *z is the last character
      if (*z == '\\' || *z == '/')
         if (z != t+2 || t[1] != ':') // but don't strip it if it's e.g. "c:/"
            *z = 0;
      if (*z == '\\')
         *z = '/'; // canonicalize to make sure it matches db
   }
   return t;
}